

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

value_type __thiscall
andres::
BinaryViewExpressionScalarFirst<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_int,_andres::marray_detail::Times<int,_short,_int>_>
::operator()(BinaryViewExpressionScalarFirst<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_int,_andres::marray_detail::Times<int,_short,_int>_>
             *this,size_t c0,size_t c1,size_t c2)

{
  View<short,_false,_std::allocator<unsigned_long>_> *this_00;
  pointer psVar1;
  size_t sVar2;
  size_t sVar3;
  runtime_error *this_01;
  
  this_00 = this->e_;
  View<short,_false,_std::allocator<unsigned_long>_>::testInvariant(this_00);
  psVar1 = this_00->data_;
  if ((psVar1 != (pointer)0x0) && ((this_00->geometry_).dimension_ == 3)) {
    sVar2 = View<short,_false,_std::allocator<unsigned_long>_>::strides(this_00,0);
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::elementAccessHelper<unsigned_long>
                      (this_00,3,c1,c2);
    return (int)psVar1[sVar2 * c0 + sVar3] * this->scalar_;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"Assertion failed.");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const value_type operator()(const std::size_t c0, const std::size_t c1, const std::size_t c2) const 
        { return binaryFunctor_(scalar_, e_(c0, c1, c2)); }